

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O2

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(Iterator *this,Node *n)

{
  long lVar1;
  anon_union_8_2_94730038_for_Vector2<long>_3 aVar2;
  Node *local_18;
  
  local_18 = n;
  ::std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 *)this);
  (this->current).first.field_0.x = 0;
  (this->current).first.field_1.y = 0;
  (this->current).second = 0;
  if (n != (Node *)0x0) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)this,&local_18);
    lVar1 = local_18->value;
    aVar2 = (local_18->pt).field_1;
    (this->current).first.field_0 = (local_18->pt).field_0;
    (this->current).first.field_1 = aVar2;
    (this->current).second = lVar1;
  }
  return;
}

Assistant:

KDTree<CoordType, ValueType>::Iterator::Iterator(Node* n) {
  if (n) {
    this->pending.emplace_back(n);
    this->current = std::make_pair(n->pt, n->value);
  }
}